

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satVec.h
# Opt level: O2

int sat_solver_enqueue(sat_solver *s,lit l,int from)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = l >> 1;
  if (s->pFreqs[iVar1] == '\0') {
    s->pFreqs[iVar1] = '\x01';
  }
  uVar2 = (uint)s->assigns[iVar1];
  if (uVar2 == 3) {
    s->assigns[iVar1] = (byte)l & 1;
    s->levels[iVar1] = (s->trail_lim).size;
    s->reasons[iVar1] = from;
    iVar1 = s->qtail;
    s->qtail = iVar1 + 1;
    s->trail[iVar1] = l;
    return 1;
  }
  return (int)((l & 1U) == uVar2);
}

Assistant:

static inline int  lit_var  (lit l)        { return l >> 1; }